

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O1

int CsvHelper::read_number(int *number,size_t start,char *buffer,size_t buffer_max)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  char text [64];
  char local_68 [72];
  
  sVar7 = start;
  if (start < buffer_max) {
    do {
      start = sVar7;
      cVar1 = buffer[start];
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        if (cVar1 == '\"') {
          start = start + 1;
          if (buffer_max <= start) goto LAB_0016d2d8;
          bVar3 = false;
          iVar5 = -1;
          iVar4 = 0;
          goto LAB_0016d25a;
        }
        break;
      }
      sVar7 = start + 1;
      start = buffer_max;
    } while (buffer_max != sVar7);
  }
  if (start < buffer_max) {
    iVar4 = 0;
    do {
      cVar1 = buffer[start];
      sVar7 = start;
      if ((cVar1 == '\0') || (cVar1 == ',')) break;
      if (iVar4 < 0x3f) {
        local_68[iVar4] = cVar1;
        iVar4 = iVar4 + 1;
      }
      start = start + 1;
      sVar7 = buffer_max;
    } while (buffer_max != start);
  }
  else {
LAB_0016d2d8:
    iVar4 = 0;
    sVar7 = start;
  }
LAB_0016d2da:
  local_68[iVar4] = '\0';
  iVar5 = atoi(local_68);
  *number = iVar5;
  uVar8 = sVar7;
  if (sVar7 < buffer_max) {
    do {
      cVar1 = buffer[sVar7];
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        uVar8 = sVar7;
        if (cVar1 == ',') {
          uVar8 = sVar7 + 1;
        }
        break;
      }
      sVar7 = sVar7 + 1;
      uVar8 = buffer_max;
    } while (buffer_max != sVar7);
  }
  return (int)uVar8;
LAB_0016d25a:
  do {
    cVar1 = buffer[start];
    sVar7 = start;
    if (cVar1 == ',') {
      bVar2 = iVar4 - iVar5 != 3 && bVar3;
      bVar3 = true;
      iVar5 = iVar4;
      if (bVar2) {
        lVar6 = (long)iVar4;
        iVar4 = iVar4 + 1;
        local_68[lVar6] = ',';
        break;
      }
    }
    else {
      if (cVar1 == '\0') break;
      if (cVar1 == '\"') {
        sVar7 = start + 1;
        break;
      }
      if (iVar4 < 0x3f) {
        local_68[iVar4] = cVar1;
        iVar4 = iVar4 + 1;
      }
    }
    start = start + 1;
    sVar7 = buffer_max;
  } while (start < buffer_max);
  goto LAB_0016d2da;
}

Assistant:

int CsvHelper::read_number(int * number, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;
    char text[64];
    int text_max = sizeof(text);
    int has_comma = 0;
    int last_comma_index = -1;


    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, remove the quotes */
    if (start < buffer_max && buffer[start] == '"')
    {
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
                /* Skip the quote and break. */
                start++;
                break;
            }
            else if (buffer[start] == ',')
            {
                /* Skip the comma unless there is a syntax error. */
                if (has_comma != 0)
                {
                    if ((x - last_comma_index) != 3)
                    {
                        text[x++] = ',';
                        break;
                    }
                }

                has_comma = 1;
                last_comma_index = x;
                start++;
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    *number = atoi(text);

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}